

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O0

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::
visit_depth_all<transwarp::detail::add_listener_per_event_visitor>
          (task_impl_base<_1a67ba37_> *this,add_listener_per_event_visitor *visitor)

{
  bool bVar1;
  element_type *this_00;
  size_t sVar2;
  reference ppiVar3;
  itask *task;
  iterator __end3;
  iterator __begin3;
  vector<transwarp::itask_*,_std::allocator<transwarp::itask_*>_> *__range3;
  push_task_visitor local_40;
  function<void_(transwarp::itask_&)> local_38;
  add_listener_per_event_visitor *local_18;
  add_listener_per_event_visitor *visitor_local;
  task_impl_base<_1a67ba37_> *this_local;
  
  local_18 = visitor;
  visitor_local = (add_listener_per_event_visitor *)this;
  bVar1 = std::vector<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>::empty
                    (&this->depth_tasks_);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->node_);
    sVar2 = node::get_id(this_00);
    std::vector<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>::reserve
              (&this->depth_tasks_,sVar2 + 1);
    push_task_visitor::push_task_visitor(&local_40,&this->depth_tasks_);
    std::function<void(transwarp::itask&)>::function<transwarp::detail::push_task_visitor,void>
              ((function<void(transwarp::itask&)> *)&local_38,&local_40);
    (*(this->super_task<void>).super_itask._vptr_itask[0x32])(this,&local_38);
    std::function<void_(transwarp::itask_&)>::~function(&local_38);
    (*(this->super_task<void>).super_itask._vptr_itask[0x33])();
  }
  __end3 = std::vector<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>::begin
                     (&this->depth_tasks_);
  task = (itask *)std::vector<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>::end
                            (&this->depth_tasks_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<transwarp::itask_**,_std::vector<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>_>
                                     *)&task), bVar1) {
    ppiVar3 = __gnu_cxx::
              __normal_iterator<transwarp::itask_**,_std::vector<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>_>
              ::operator*(&__end3);
    add_listener_per_event_visitor::operator()(local_18,*ppiVar3);
    __gnu_cxx::
    __normal_iterator<transwarp::itask_**,_std::vector<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

void visit_depth_all(Visitor& visitor) {
        if (depth_tasks_.empty()) {
            depth_tasks_.reserve(node_->get_id() + 1);
            visit_depth(transwarp::detail::push_task_visitor(depth_tasks_));
            unvisit();
        }
        for (transwarp::itask* task : depth_tasks_) {
            visitor(*task);
        }
    }